

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::viewIndex(QTreeViewPrivate *this,QModelIndex *_index)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  QTreeViewItem *pQVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  quintptr *pqVar11;
  uint uVar12;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QAbstractItemModel *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (_index->m).ptr;
  uVar4 = 0xffffffff;
  if ((pQVar2 != (QAbstractItemModel *)0x0 && -1 < (_index->r | _index->c)) &&
     (uVar10 = (this->viewItems).d.size, uVar10 != 0)) {
    local_38 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    if (_index->c == 0) {
      local_38 = (_index->m).ptr;
      local_48 = *(undefined1 **)_index;
      puStack_40 = (undefined1 *)_index->i;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x70))(&local_48,pQVar2,_index->r,0);
    }
    iVar1 = this->lastViewedItem;
    uVar12 = (uint)uVar10;
    uVar4 = uVar12 - iVar1;
    if ((int)(iVar1 - 1U) < (int)(uVar12 - iVar1)) {
      uVar4 = iVar1 - 1U;
    }
    if (0 < (int)uVar4) {
      pQVar3 = (this->viewItems).d.ptr;
      pqVar11 = &pQVar3[iVar1].index.i;
      lVar8 = 0;
      do {
        iVar7 = (int)lVar8;
        if ((((QModelIndex *)(pqVar11 + -1))->r == (int)local_48) &&
           ((undefined1 *)*pqVar11 == puStack_40)) {
          uVar5 = iVar1 - iVar7;
          goto LAB_0059cb71;
        }
        iVar6 = iVar1 + -1 + iVar7;
        if ((pQVar3[iVar6].index.r == (int)local_48) &&
           ((undefined1 *)pQVar3[iVar6].index.i == puStack_40)) {
          uVar5 = (iVar1 + iVar7) - 1;
          goto LAB_0059cb71;
        }
        lVar8 = lVar8 + -1;
        pqVar11 = pqVar11 + 5;
      } while (-lVar8 != (ulong)uVar4);
    }
    uVar9 = 0;
    if (0 < (int)(iVar1 + uVar4)) {
      uVar9 = (ulong)(iVar1 + uVar4);
    }
    if ((int)uVar9 < (int)uVar12) {
      pqVar11 = &(this->viewItems).d.ptr[uVar9].index.i;
      do {
        if ((((QModelIndex *)(pqVar11 + -1))->r == (int)local_48) &&
           ((undefined1 *)*pqVar11 == puStack_40)) {
          uVar5 = (uint)uVar9;
          goto LAB_0059cb71;
        }
        uVar9 = uVar9 + 1;
        pqVar11 = pqVar11 + 5;
      } while ((uVar10 & 0xffffffff) != uVar9);
    }
    uVar5 = iVar1 - uVar4;
    if ((int)uVar12 <= (int)(iVar1 - uVar4)) {
      uVar5 = uVar12;
    }
    uVar4 = 0xffffffff;
    if (0 < (int)uVar5) {
      uVar10 = (ulong)uVar5 + 1;
      pqVar11 = &(this->viewItems).d.ptr[(ulong)uVar5 - 1].index.i;
      do {
        uVar5 = uVar5 - 1;
        if ((((QModelIndex *)(pqVar11 + -1))->r == (int)local_48) &&
           ((undefined1 *)*pqVar11 == puStack_40)) goto LAB_0059cb71;
        uVar10 = uVar10 - 1;
        pqVar11 = pqVar11 + -5;
      } while (1 < uVar10);
    }
  }
LAB_0059cb79:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar4;
LAB_0059cb71:
  this->lastViewedItem = uVar5;
  uVar4 = uVar5;
  goto LAB_0059cb79;
}

Assistant:

int QTreeViewPrivate::viewIndex(const QModelIndex &_index) const
{
    if (!_index.isValid() || viewItems.isEmpty())
        return -1;

    const int totalCount = viewItems.size();
    const QModelIndex index = _index.sibling(_index.row(), 0);
    const int row = index.row();
    const quintptr internalId = index.internalId();

    // We start nearest to the lastViewedItem
    int localCount = qMin(lastViewedItem - 1, totalCount - lastViewedItem);
    for (int i = 0; i < localCount; ++i) {
        const QModelIndex &idx1 = viewItems.at(lastViewedItem + i).index;
        if (idx1.row() == row && idx1.internalId() == internalId) {
            lastViewedItem = lastViewedItem + i;
            return lastViewedItem;
        }
        const QModelIndex &idx2 = viewItems.at(lastViewedItem - i - 1).index;
        if (idx2.row() == row && idx2.internalId() == internalId) {
            lastViewedItem = lastViewedItem - i - 1;
            return lastViewedItem;
        }
    }

    for (int j = qMax(0, lastViewedItem + localCount); j < totalCount; ++j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }
    for (int j = qMin(totalCount, lastViewedItem - localCount) - 1; j >= 0; --j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }

    // nothing found
    return -1;
}